

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_dse_ustore(jit_State *J)

{
  jit_State *pjVar1;
  short sVar2;
  ushort uVar3;
  long lVar4;
  uint8_t uVar5;
  uint uVar6;
  AliasRet AVar7;
  TRef TVar8;
  long in_RDI;
  IRIns *obar;
  IRRef1 *bp;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRRef1 *refp;
  IRIns *xr;
  IRRef val;
  IRRef xref;
  undefined2 *local_50;
  ushort *local_48;
  jit_State *in_stack_ffffffffffffffc0;
  uint local_2c;
  uint8_t *local_28;
  
  uVar6 = (uint)*(ushort *)(in_RDI + 0x98);
  sVar2 = *(short *)(in_RDI + 0x9a);
  lVar4 = *(long *)(in_RDI + 0x10);
  local_28 = (uint8_t *)(in_RDI + 0x1d2);
  uVar3 = *(ushort *)local_28;
  while (local_2c = (uint)uVar3, uVar6 < local_2c) {
    pjVar1 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)local_2c * 8);
    AVar7 = aa_uref((IRIns *)(lVar4 + (ulong)uVar6 * 8),
                    (IRIns *)(*(long *)(in_RDI + 0x10) +
                             (ulong)(ushort)(pjVar1->cur).nextgc.gcptr32 * 8));
    if (AVar7 != ALIAS_NO) {
      if (AVar7 == ALIAS_MAY) {
        if (*(short *)((long)&(pjVar1->cur).nextgc.gcptr32 + 2) != sVar2) break;
      }
      else if (AVar7 == ALIAS_MUST) {
        if (*(short *)((long)&(pjVar1->cur).nextgc.gcptr32 + 2) == sVar2) {
          return 4;
        }
        if (*(ushort *)(in_RDI + 0x162) < local_2c) {
          in_stack_ffffffffffffffc0 =
               (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)(*(int *)(in_RDI + 8) - 1) * 8);
          goto LAB_00144f00;
        }
        break;
      }
    }
    local_28 = &(pjVar1->cur).topslot;
    uVar3._0_1_ = (pjVar1->cur).topslot;
    uVar3._1_1_ = (pjVar1->cur).linktype;
  }
LAB_0014508d:
  TVar8 = lj_ir_emit(in_stack_ffffffffffffffc0);
  return TVar8;
LAB_00144f00:
  if (in_stack_ffffffffffffffc0 <= pjVar1) goto LAB_00144f36;
  if (((in_stack_ffffffffffffffc0->cur).marked & 0x80) != 0) goto LAB_0014508d;
  in_stack_ffffffffffffffc0 = (jit_State *)&in_stack_ffffffffffffffc0[-1].errinfo;
  goto LAB_00144f00;
LAB_00144f36:
  uVar5 = (pjVar1->cur).linktype;
  local_28[0] = (pjVar1->cur).topslot;
  local_28[1] = uVar5;
  (pjVar1->cur).gct = '\f';
  (pjVar1->cur).marked = '\0';
  *(undefined2 *)((long)&(pjVar1->cur).nextgc.gcptr32 + 2) = 0;
  *(undefined2 *)&(pjVar1->cur).nextgc.gcptr32 = 0;
  (pjVar1->cur).topslot = '\0';
  (pjVar1->cur).linktype = '\0';
  if (((local_2c + 1 < *(uint *)(in_RDI + 8)) &&
      (*(char *)((long)&(pjVar1->cur).gclist.gcptr32 + 1) == 'S')) &&
     ((ushort)(pjVar1->cur).nins == uVar6)) {
    local_48 = (ushort *)(in_RDI + 0x1e6);
    local_50 = (undefined2 *)(*(long *)(in_RDI + 0x10) + (ulong)*local_48 * 8);
    while (local_2c + 1 < (uint)*local_48) {
      local_48 = local_50 + 3;
      local_50 = (undefined2 *)(*(long *)(in_RDI + 0x10) + (ulong)*local_48 * 8);
    }
    *local_48 = local_50[3];
    *(undefined1 *)((long)local_50 + 5) = 0xc;
    *(undefined1 *)(local_50 + 2) = 0;
    local_50[1] = 0;
    *local_50 = 0;
    local_50[3] = 0;
  }
  goto LAB_0014508d;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ustore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[IR_USTORE];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads). */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	store->o = IR_NOP;
	store->t.irt = IRT_NIL;
	store->op1 = store->op2 = 0;
	store->prev = 0;
	if (ref+1 < J->cur.nins &&
	    store[1].o == IR_OBAR && store[1].op1 == xref) {
	  IRRef1 *bp = &J->chain[IR_OBAR];
	  IRIns *obar;
	  for (obar = IR(*bp); *bp > ref+1; obar = IR(*bp))
	    bp = &obar->prev;
	  /* Remove OBAR, too. */
	  *bp = obar->prev;
	  obar->o = IR_NOP;
	  obar->t.irt = IRT_NIL;
	  obar->op1 = obar->op2 = 0;
	  obar->prev = 0;
	}
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}